

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O3

void __thiscall remote::Module::CacheSymbolData(Module *this)

{
  short sVar1;
  pointer pRVar2;
  _Alloc_hider _Var3;
  char cVar4;
  int *__ptr;
  Module *this_00;
  void *buffer;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  pRVar2 = (this->regions).super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
           _M_impl.super__Vector_impl_data._M_start;
  _Var3._M_p = (pRVar2->pathname)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,_Var3._M_p,_Var3._M_p + (pRVar2->pathname)._M_string_length);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_38 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No path!",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  else {
    pRVar2 = (this->regions).super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
             _M_impl.super__Vector_impl_data._M_start;
    _Var3._M_p = (pRVar2->pathname)._M_dataplus._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,_Var3._M_p,_Var3._M_p + (pRVar2->pathname)._M_string_length);
    __ptr = (int *)elf::Open(local_40);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    if (__ptr != (int *)0x0) {
      if (*__ptr == 0x464c457f) {
        sVar1 = *(short *)((long)__ptr + 0x12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ELF OK!",7);
        cVar4 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        buffer = (void *)(ulong)(uint)(int)cVar4;
        this_00 = (Module *)std::ostream::put('X');
        std::ostream::flush();
        if (sVar1 == 1) {
          CacheSymbolData32(this_00,buffer);
        }
        else if ((sVar1 == 0x3e) || (sVar1 == 0x32)) {
          CacheSymbolData64(this_00,__ptr);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Arch problems??? Fgt.",0x15);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
        }
        elf::Close(__ptr);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ELF header magic failed",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        free(__ptr);
      }
    }
  }
  return;
}

Assistant:

void remote::Module::CacheSymbolData() {
    if(GetPath().length() == 0) {
        std::cout << "No path!" << std::endl;
        return;
    }

    void* elf_data = elf::Open(GetPath().c_str());

    if(elf_data == NULL)
        return;

    // We now have elf data!
    // We can check the 'basic' variables like magic and machine without proper 32/64 alignment
    // We re-cast later when we have determined the proper arch
    Elf64_Ehdr ehdr = *(Elf64_Ehdr*) elf_data;

    if(memcmp(ehdr.e_ident, ELFMAG, SELFMAG) != 0) {
        std::cout << "ELF header magic failed" << std::endl;
        free(elf_data);
        return;
    }
    std::cout << "ELF OK!" << std::endl;

    if(ehdr.e_machine == EM_IA_64 || ehdr.e_machine == EM_X86_64) {
        CacheSymbolData64(elf_data);
    } else if(ehdr.e_machine == EM_M32) {
        CacheSymbolData32(elf_data);
    } else {
        std::cout << "Arch problems??? Fgt." << std::endl;
    }

    elf::Close(elf_data);
}